

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileExists(char *filename,bool isFile)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  byte local_56;
  allocator local_41;
  string local_40;
  byte local_19;
  char *pcStack_18;
  bool isFile_local;
  char *filename_local;
  
  local_19 = isFile;
  pcStack_18 = filename;
  bVar2 = FileExists(filename);
  pcVar1 = pcStack_18;
  if (bVar2) {
    bVar2 = (local_19 & 1) != 0;
    local_56 = 1;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
      bVar3 = FileIsDirectory(&local_40);
      local_56 = bVar3 ^ 0xff;
    }
    filename_local._7_1_ = local_56 & 1;
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
  }
  else {
    filename_local._7_1_ = 0;
  }
  return (bool)(filename_local._7_1_ & 1);
}

Assistant:

bool SystemTools::FileExists(const char* filename, bool isFile)
{
  if(SystemTools::FileExists(filename))
    {
    // If isFile is set return not FileIsDirectory,
    // so this will only be true if it is a file
    return !isFile || !SystemTools::FileIsDirectory(filename);
    }
  return false;
}